

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

bool __thiscall
compiler::EmissionContext::GetDeclarationIndex
          (EmissionContext *this,string *var,size_t *index,bool considerPartiallyBound)

{
  size_t sVar1;
  pointer pVVar2;
  pointer pcVar3;
  size_t __n;
  iterator __position;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  int iVar4;
  ulong uVar5;
  char *this_00;
  long lVar6;
  ClosureContext *__args;
  bool *pbVar7;
  
  sVar1 = this->firstFreeVariablesIndex;
  if (sVar1 != 0) {
    pVVar2 = (this->variables).
             super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->variables).
                   super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 3) *
            -0x3333333333333333;
    pcVar3 = (var->_M_dataplus)._M_p;
    __n = var->_M_string_length;
    lVar6 = 1 - sVar1;
    pbVar7 = &pVVar2[sVar1 - 1].isFullyBound;
    do {
      if (uVar5 <= sVar1 - 1) {
        __args = (ClosureContext *)-lVar6;
        this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   __args,uVar5);
        __position._M_current =
             *(ClosureContext **)
              ((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>> *)this_00
              + 8);
        if (__position._M_current ==
            *(ClosureContext **)
             ((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>> *)this_00 +
             0x10)) {
          std::vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>>::
          _M_realloc_insert<compiler::ClosureContext_const&>
                    ((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>> *)
                     this_00,__position,__args);
          return (bool)extraout_AL_00;
        }
        ((__position._M_current)->value)._M_dataplus._M_p =
             (pointer)&((__position._M_current)->value).field_2;
        pcVar3 = (__args->value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__position._M_current,pcVar3,pcVar3 + (__args->value)._M_string_length)
        ;
        sVar1 = __args->localScopeIndex;
        (__position._M_current)->outerScopeCount = __args->outerScopeCount;
        (__position._M_current)->localScopeIndex = sVar1;
        *(long *)((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>> *)
                  this_00 + 8) =
             *(long *)((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>> *)
                       this_00 + 8) + 0x30;
        return (bool)extraout_AL;
      }
      if (((*pbVar7 != false || considerPartiallyBound) && (*(size_t *)(pbVar7 + -0x18) == __n)) &&
         ((__n == 0 ||
          (iVar4 = bcmp((((VariableDeclaration *)(pbVar7 + -0x20))->value)._M_dataplus._M_p,pcVar3,
                        __n), iVar4 == 0)))) {
        *index = -lVar6;
        return true;
      }
      lVar6 = lVar6 + 1;
      pbVar7 = pbVar7 + -0x28;
    } while (lVar6 != 1);
  }
  return false;
}

Assistant:

bool GetDeclarationIndex(const std::string & var, std::size_t& index, bool considerPartiallyBound) {

    for (std::size_t i = this->firstFreeVariablesIndex; i-- > 0;) {
      if (!variables.at(i).isFullyBound && !considerPartiallyBound) {
        continue;
      }

      if (variables.at(i).value == var) {
        index = i;
        return true;
      }
    }

    return false;
  }